

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O0

void __thiscall Cleaner::RemoveEdgeFiles(Cleaner *this,Edge *edge)

{
  ulong uVar1;
  undefined1 local_68 [8];
  string rspfile;
  undefined1 local_38 [8];
  string depfile;
  Edge *edge_local;
  Cleaner *this_local;
  
  depfile.field_2._8_8_ = edge;
  Edge::GetUnescapedDepfile_abi_cxx11_((string *)local_38,edge);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    Remove(this,(string *)local_38);
  }
  Edge::GetUnescapedRspfile_abi_cxx11_((string *)local_68,(Edge *)depfile.field_2._8_8_);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    Remove(this,(string *)local_68);
  }
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Cleaner::RemoveEdgeFiles(Edge* edge) {
  string depfile = edge->GetUnescapedDepfile();
  if (!depfile.empty())
    Remove(depfile);

  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty())
    Remove(rspfile);
}